

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdDmaVtx::emulate_mthd(MthdDmaVtx *this)

{
  bool bVar1;
  uint uVar2;
  bool local_1a;
  bool prot_err;
  uint uStack_14;
  bool bad;
  int dcls;
  uint32_t rval;
  MthdDmaVtx *this_local;
  
  uStack_14 = (this->super_SingleMthdTest).super_MthdTest.val & 0xffff;
  uVar2 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.pobj[0] << 0x34) >> 0x34);
  if (uVar2 == 0x30) {
    uStack_14 = 0;
  }
  bVar1 = false;
  if (((uVar2 != 0x30) && (uVar2 != 0x3d)) && (uVar2 != 2)) {
    bVar1 = true;
  }
  if ((bVar1) &&
     ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d << 0x28)
      < 0)) {
    nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,2);
  }
  local_1a = false;
  if ((uVar2 != 0x30) &&
     (local_1a = ((ulong)(this->super_SingleMthdTest).super_MthdTest.pobj[0] << 0x24) >> 0x38 != 0
                 || ((this->super_SingleMthdTest).super_MthdTest.pobj[1] & 0xff) != 0xff,
     ((ulong)(this->super_SingleMthdTest).super_MthdTest.pobj[0] << 0x32) >> 0x3e == 0)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.intr =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.intr | 0x400;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fifo_enable = 0;
  }
  if (local_1a) {
    nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,4);
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_dma =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_dma & 0xffff0000 |
       uStack_14;
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rval = val & 0xffff;
		int dcls = extr(pobj[0], 0, 12);
		if (dcls == 0x30)
			rval = 0;
		bool bad = false;
		if (dcls != 0x30 && dcls != 0x3d && dcls != 2)
			bad = true;
		if (bad && extr(exp.debug_d, 23, 1))
			nv04_pgraph_blowup(&exp, 2);
		bool prot_err = false;
		if (dcls != 0x30) {
			if (extr(pobj[1], 0, 8) != 0xff)
				prot_err = true;
			if (extr(pobj[0], 20, 8))
				prot_err = true;
			if (!extr(pobj[0], 12, 2)) {
				exp.intr |= 0x400;
				exp.fifo_enable = 0;
			}
		}
#if 0
		// XXX: figure this out
		if (dcls == 0x30 && nv04_pgraph_is_nv15p(&chipset)) {
			exp.intr |= 0x400;
			exp.fifo_enable = 0;
		}
#endif
		if (prot_err)
			nv04_pgraph_blowup(&exp, 4);
		insrt(exp.celsius_dma, 0, 16, rval);
	}